

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::SmallVector
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this)

{
  TypedID<(spirv_cross::Types)1> *pTVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_local;
  
  VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::VectorView
            (&this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  this->buffer_capacity = 0;
  pTVar1 = AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::data
                     (&this->stack_storage);
  (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr = pTVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}